

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
::checkObjectType(SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                  *this,string *name,char type)

{
  _Rb_tree_color *p_Var1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  
  std::mutex::lock(&this->mapLock);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::find(&(this->typeMap)._M_t,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->typeMap)._M_t._M_impl.super__Rb_tree_header) {
    bVar4 = false;
  }
  else {
    p_Var3 = *(_Base_ptr *)(cVar2._M_node + 2);
    do {
      bVar5 = p_Var3 == cVar2._M_node[2]._M_parent;
      bVar4 = !bVar5;
      if (bVar5) break;
      p_Var1 = &p_Var3->_M_color;
      p_Var3 = (_Base_ptr)((long)&p_Var3->_M_color + 1);
    } while ((char)*p_Var1 != type);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar4;
}

Assistant:

bool checkObjectType(const std::string& name, Y type) const
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = typeMap.find(name);
        if (fnd != typeMap.end()) {
            for (auto& stype : fnd->second) {
                if (stype == type) {
                    return true;
                }
            }
        }
        return false;
    }